

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

jsparser_ctx * ctemplate_htmlparser::jsparser_new(void)

{
  statemachine_definition *psVar1;
  statemachine_ctx *psVar2;
  jsparser_ctx *js;
  
  js = (jsparser_ctx *)calloc(1,0x30);
  if (js == (jsparser_ctx *)0x0) {
    js = (jsparser_ctx *)0x0;
  }
  else {
    psVar1 = create_statemachine_definition();
    js->statemachine_def = psVar1;
    if (js->statemachine_def == (statemachine_definition *)0x0) {
      js = (jsparser_ctx *)0x0;
    }
    else {
      psVar2 = statemachine_new(js->statemachine_def,js);
      js->statemachine = psVar2;
      if (js->statemachine == (statemachine_ctx *)0x0) {
        js = (jsparser_ctx *)0x0;
      }
      else {
        jsparser_reset(js);
      }
    }
  }
  return js;
}

Assistant:

jsparser_ctx *jsparser_new()
{
    jsparser_ctx *js;

    js = CAST(jsparser_ctx *, calloc(1, sizeof(jsparser_ctx)));
    if (js == NULL)
      return NULL;

    js->statemachine_def = create_statemachine_definition();
    if (js->statemachine_def == NULL)
      return NULL;

    js->statemachine = statemachine_new(js->statemachine_def, js);
    if (js->statemachine == NULL)
      return NULL;

    jsparser_reset(js);

    return js;
}